

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void minmaxStep(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  Mem *pFrom;
  int iVar1;
  Mem *pTo;
  CollSeq *pColl_00;
  void *pvVar2;
  sqlite3 *psVar3;
  CollSeq *pColl;
  int cmp;
  int max;
  Mem *pBest;
  Mem *pArg;
  sqlite3_value **argv_local;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  pFrom = *argv;
  pTo = (Mem *)sqlite3_aggregate_context(context,0x38);
  if (pTo != (Mem *)0x0) {
    iVar1 = sqlite3_value_type(*argv);
    if (iVar1 == 5) {
      if (pTo->flags != 0) {
        sqlite3SkipAccumulatorLoad(context);
      }
    }
    else if (pTo->flags == 0) {
      psVar3 = sqlite3_context_db_handle(context);
      pTo->db = psVar3;
      sqlite3VdbeMemCopy(pTo,pFrom);
    }
    else {
      pColl_00 = sqlite3GetFuncCollSeq(context);
      pvVar2 = sqlite3_user_data(context);
      iVar1 = sqlite3MemCompare(pTo,pFrom,pColl_00);
      if (((pvVar2 != (void *)0x0) && (iVar1 < 0)) || ((pvVar2 == (void *)0x0 && (0 < iVar1)))) {
        sqlite3VdbeMemCopy(pTo,pFrom);
      }
      else {
        sqlite3SkipAccumulatorLoad(context);
      }
    }
  }
  return;
}

Assistant:

static void minmaxStep(
  sqlite3_context *context, 
  int NotUsed, 
  sqlite3_value **argv
){
  Mem *pArg  = (Mem *)argv[0];
  Mem *pBest;
  UNUSED_PARAMETER(NotUsed);

  pBest = (Mem *)sqlite3_aggregate_context(context, sizeof(*pBest));
  if( !pBest ) return;

  if( sqlite3_value_type(argv[0])==SQLITE_NULL ){
    if( pBest->flags ) sqlite3SkipAccumulatorLoad(context);
  }else if( pBest->flags ){
    int max;
    int cmp;
    CollSeq *pColl = sqlite3GetFuncCollSeq(context);
    /* This step function is used for both the min() and max() aggregates,
    ** the only difference between the two being that the sense of the
    ** comparison is inverted. For the max() aggregate, the
    ** sqlite3_user_data() function returns (void *)-1. For min() it
    ** returns (void *)db, where db is the sqlite3* database pointer.
    ** Therefore the next statement sets variable 'max' to 1 for the max()
    ** aggregate, or 0 for min().
    */
    max = sqlite3_user_data(context)!=0;
    cmp = sqlite3MemCompare(pBest, pArg, pColl);
    if( (max && cmp<0) || (!max && cmp>0) ){
      sqlite3VdbeMemCopy(pBest, pArg);
    }else{
      sqlite3SkipAccumulatorLoad(context);
    }
  }else{
    pBest->db = sqlite3_context_db_handle(context);
    sqlite3VdbeMemCopy(pBest, pArg);
  }
}